

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateTypenameCheck
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *chainedReturnParams,
          bool definition,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataTypes,CommandFlavourFlags flavourFlags)

{
  bool bVar1;
  size_type sVar2;
  const_reference __x;
  const_reference __str;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator<char> local_189;
  string local_188;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  CommandFlavourFlagBits local_e1;
  undefined1 local_e0 [8];
  string extendedElementType;
  CommandFlavourFlagBits local_a1;
  undefined1 local_a0 [8];
  string elementType;
  ulong local_70;
  size_t i;
  undefined1 local_60 [8];
  string enableIf;
  bool definition_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *chainedReturnParams_local;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *vectorParams_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams_local;
  VulkanHppGenerator *this_local;
  string *psStack_10;
  CommandFlavourFlags flavourFlags_local;
  string *typenameCheck;
  
  this_local._7_1_ = flavourFlags.m_mask;
  enableIf.field_2._M_local_buf[0xe] = '\0';
  enableIf.field_2._M_local_buf[0xf] = definition;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_60);
  i._7_1_ = 4;
  bVar1 = Flags<CommandFlavourFlagBits>::operator&
                    ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),
                     (CommandFlavourFlagBits *)((long)&i + 7));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    for (local_70 = 0;
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(returnParams),
        local_70 < sVar2; local_70 = local_70 + 1) {
      __x = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (returnParams,local_70);
      bVar1 = std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::contains(vectorParams,__x);
      if (bVar1) {
        local_a1 = chained;
        bVar1 = Flags<CommandFlavourFlagBits>::operator&
                          ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),&local_a1);
        extendedElementType.field_2._M_local_buf[0xd] = '\0';
        if ((bVar1) &&
           (bVar1 = std::ranges::__any_of_fn::
                    operator()<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:12460:79)>
                              ((__any_of_fn *)&std::ranges::any_of,chainedReturnParams,returnParams,
                               local_70), bVar1)) {
          std::allocator<char>::allocator();
          extendedElementType.field_2._M_local_buf[0xd] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,"StructureChain",
                     (allocator<char> *)(extendedElementType.field_2._M_local_buf + 0xe));
        }
        else {
          __str = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](dataTypes,local_70);
          std::__cxx11::string::string((string *)local_a0,__str);
        }
        if ((extendedElementType.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(extendedElementType.field_2._M_local_buf + 0xe));
        }
        std::__cxx11::string::string
                  ((string *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
        local_e1 = unique;
        bVar1 = Flags<CommandFlavourFlagBits>::operator&
                          ((Flags<CommandFlavourFlagBits> *)((long)&this_local + 7),&local_e1);
        if (bVar1) {
          std::operator+(&local_128,"UniqueHandle<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0);
          std::operator+(&local_108,&local_128,", Dispatch>");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"VULKAN_HPP_NAMESPACE::",&local_189);
        stripPrefix(&local_168,(string *)local_a0,&local_188);
        anon_unknown.dwarf_b1723::startUpperCase(&local_148,&local_168);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60)
        ;
        if (!bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     " && ");
        }
        std::operator+(&local_210,"std::is_same<typename ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0
                      );
        std::operator+(&local_1f0,&local_210,"Allocator::value_type, ");
        std::operator+(&local_1d0,&local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                      );
        std::operator+(&local_1b0,&local_1d0," > ::value ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)local_e0);
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
    if (!bVar1) {
      std::operator+(&local_270,", typename std::enable_if<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_250,&local_270,", int>::type");
      __rhs = " = 0";
      if ((enableIf.field_2._M_local_buf[0xf] & 1U) != 0) {
        __rhs = "";
      }
      std::operator+(&local_230,&local_250,__rhs);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
    }
  }
  enableIf.field_2._M_local_buf[0xe] = '\x01';
  std::__cxx11::string::~string((string *)local_60);
  if ((enableIf.field_2._M_local_buf[0xe] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateTypenameCheck( std::vector<size_t> const &               returnParams,
                                                       std::map<size_t, VectorParamData> const & vectorParams,
                                                       std::vector<size_t> const &               chainedReturnParams,
                                                       bool                                      definition,
                                                       std::vector<std::string> const &          dataTypes,
                                                       CommandFlavourFlags                       flavourFlags ) const
{
  std::string typenameCheck, enableIf;
  if ( !( flavourFlags & CommandFlavourFlagBits::singular ) )
  {
    for ( size_t i = 0; i < returnParams.size(); ++i )
    {
      if ( vectorParams.contains( returnParams[i] ) )
      {
        std::string elementType         = ( ( flavourFlags & CommandFlavourFlagBits::chained ) &&
                                    std::ranges::any_of( chainedReturnParams, [&returnParams, i]( size_t crp ) { return crp == returnParams[i]; } ) )
                                          ? "StructureChain"
                                          : dataTypes[i];
        std::string extendedElementType = elementType;
        if ( flavourFlags & CommandFlavourFlagBits::unique )
        {
          extendedElementType = "UniqueHandle<" + elementType + ", Dispatch>";
        }
        elementType = startUpperCase( stripPrefix( elementType, "VULKAN_HPP_NAMESPACE::" ) );
        if ( !enableIf.empty() )
        {
          enableIf += " && ";
        }
        enableIf += "std::is_same<typename " + elementType + "Allocator::value_type, " + extendedElementType + " > ::value ";
      }
    }
    if ( !enableIf.empty() )
    {
      typenameCheck = ", typename std::enable_if<" + enableIf + ", int>::type" + ( definition ? "" : " = 0" );
    }
  }
  return typenameCheck;
}